

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O2

char * rtosc::Ports::collapsePath(char *p)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  char *read_pos;
  
  read_pos = p + -2;
  do {
    pcVar3 = read_pos + 2;
    read_pos = read_pos + 1;
  } while (*pcVar3 != '\0');
  pcVar3 = read_pos;
  iVar5 = 0;
  do {
    while( true ) {
      if (read_pos < p) {
        return pcVar3 + 1;
      }
      if ((((((long)read_pos - (long)p < 2) || (*read_pos != '.')) || (read_pos[-1] != '.')) ||
          (iVar4 = 1, read_pos[-2] != '/')) && (iVar4 = -1, iVar5 == 0)) break;
      read_path(&read_pos,p);
      iVar5 = iVar5 + iVar4;
    }
    do {
      iVar5 = 0;
      if (read_pos < p) break;
      cVar2 = *read_pos;
      read_pos = read_pos + -1;
      pcVar1 = pcVar3 + -1;
      *pcVar3 = cVar2;
      pcVar3 = pcVar1;
      iVar5 = 0;
    } while (cVar2 != '/');
  } while( true );
}

Assistant:

char *Ports::collapsePath(char *p)
{
    //obtain the pointer to the last non-null char
    char *p_end = p;
    while(*p_end) p_end++;
    p_end--;

    //number of subpaths to consume
    int consuming = 0;

    char *write_pos = p_end;
    char *read_pos = p_end;
    while(read_pos >= p) {
        //per path chunk either
        //(1) find a parent ref and inc consuming
        //(2) find a normal ref and consume
        //(3) find a normal ref and write through
        bool ppath = parent_path_p(read_pos, p);
        if(ppath) {
            read_path(read_pos, p);
            consuming++;
        } else if(consuming) {
            read_path(read_pos, p);
            consuming--;
        } else
            move_path(read_pos, write_pos, p);
    }
    //return last written location, not next to write
    return write_pos+1;
}